

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O0

bool __thiscall CNscContext::ParsePragmaNscIntrinsics(CNscContext *this,char *pszPragma)

{
  bool bVar1;
  char *in_RSI;
  CNscContext *in_RDI;
  char *p;
  char *local_20;
  bool local_1;
  
  local_20 = in_RSI;
  while( true ) {
    bVar1 = false;
    if ((*local_20 != '\0') && (bVar1 = true, ' ' < *local_20)) {
      bVar1 = '~' < *local_20;
    }
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  if (*local_20 == '\0') {
    bVar1 = IsNWScript(in_RDI);
    if (bVar1) {
      SetCompilingIntrinsic(in_RDI,true);
      local_1 = true;
    }
    else {
      GenerateMessage(in_RDI,NscMessage_ErrorNscIntrinsicsIsInternalOnly);
      local_1 = false;
    }
  }
  else {
    GenerateMessage(in_RDI,NscMessage_ErrorPreprocessorSyntax,"#pragma");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CNscContext::ParsePragmaNscIntrinsics (const char *pszPragma)
{
	const char *p = pszPragma;

	//
	// Make sure there isn't anything at the end
	//

	while (*p && (*p <= ' ' || *p > 126))
		p++;
	if (*p != 0)
	{
		GenerateMessage (NscMessage_ErrorPreprocessorSyntax, "#pragma");
		return false;
	}

	if (IsNWScript () == false)
	{
		GenerateMessage (NscMessage_ErrorNscIntrinsicsIsInternalOnly);
		return false;
	}

	SetCompilingIntrinsic (true);
	return true;
}